

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

char nva_rserrc(nva_err err)

{
  char local_9;
  nva_err err_local;
  
  switch(err) {
  case NVA_ERR_RANGE:
    local_9 = 'R';
    break;
  case NVA_ERR_REGSZ:
    local_9 = 'B';
    break;
  case NVA_ERR_NOSPC:
    local_9 = 'S';
    break;
  case NVA_ERR_MAP:
    local_9 = 'M';
    break;
  default:
    abort();
  }
  return local_9;
}

Assistant:

char nva_rserrc(enum nva_err err) {
	switch (err) {
		case NVA_ERR_RANGE:
			return 'R';
		case NVA_ERR_REGSZ:
			return 'B';
		case NVA_ERR_NOSPC:
			return 'S';
		case NVA_ERR_MAP:
			return 'M';
		default:
			abort();
	}
}